

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O2

void __thiscall xray_re::xr_visual_object::save_v12(xr_visual_object *this,xr_ini_writer *w)

{
  size_t __n;
  string asStack_38 [32];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  std::__cxx11::string::string(asStack_38,(string *)&this->m_reference);
  __n = 0;
  xr_ini_writer::write(w,0x1d2e0b,asStack_38,0);
  std::__cxx11::string::~string(asStack_38);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x12,__n);
  return;
}

Assistant:

void xr_visual_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("reference_name", m_reference, false);
	w->write("version", SCENEOBJ_VERSION_18);
}